

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void rtfi_handleDataFunc(void *inSparseImageBuffer,IceTInt src)

{
  IceTSparseImage srcBuffer;
  IceTInt *pIVar1;
  IceTInt rank;
  int local_1c;
  
  if (inSparseImageBuffer == (void *)0x0) {
    if (rtfi_first == '\0') {
      icetRaiseDiagnostic("Unexpected callback order in icetRenderTransferFullImages.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/common.c"
                          ,0x36);
    }
  }
  else {
    srcBuffer = icetSparseImageUnpackageFromReceive(inSparseImageBuffer);
    if (rtfi_first == '\x01') {
      icetDecompressImage(srcBuffer,rtfi_image);
    }
    else {
      icetGetIntegerv(2,&local_1c);
      pIVar1 = icetUnsafeStateGetInteger(0x2a);
      icetCompressedComposite(rtfi_image,srcBuffer,(uint)(pIVar1[src] < pIVar1[local_1c]));
    }
  }
  rtfi_first = 0;
  return;
}

Assistant:

static void rtfi_handleDataFunc(void *inSparseImageBuffer, IceTInt src) {
    if (inSparseImageBuffer == NULL) {
      /* Superfluous call from send to self. */
        if (!rtfi_first) {
            icetRaiseError("Unexpected callback order"
                           " in icetRenderTransferFullImages.",
                           ICET_SANITY_CHECK_FAIL);
        }
    } else {
        IceTSparseImage inSparseImage
            = icetSparseImageUnpackageFromReceive(inSparseImageBuffer);
        if (rtfi_first) {
            icetDecompressImage(inSparseImage, rtfi_image);
        } else {
            IceTInt rank;
            const IceTInt *process_orders;
            icetGetIntegerv(ICET_RANK, &rank);
            process_orders = icetUnsafeStateGetInteger(ICET_PROCESS_ORDERS);
            icetCompressedComposite(rtfi_image, inSparseImage,
                                    process_orders[src] < process_orders[rank]);
        }
    }
    rtfi_first = ICET_FALSE;
}